

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O3

Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> __thiscall
kj::TimerImpl::nextEvent(TimerImpl *this)

{
  Impl *pIVar1;
  _Base_ptr p_Var2;
  long in_RDI;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> MVar3;
  
  pIVar1 = (this->impl).ptr;
  p_Var2 = (pIVar1->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MVar3.ptr.field_1 = &(pIVar1->timers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != MVar3.ptr.field_1) {
    *(undefined8 *)(in_RDI + 8) = **(undefined8 **)(p_Var2 + 1);
  }
  *(bool *)in_RDI = (_Rb_tree_header *)p_Var2 != MVar3.ptr.field_1;
  MVar3.ptr._0_8_ = in_RDI;
  return (Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>)
         MVar3.ptr;
}

Assistant:

Maybe<TimePoint> TimerImpl::nextEvent() {
  auto iter = impl->timers.begin();
  if (iter == impl->timers.end()) {
    return kj::none;
  } else {
    return (*iter)->time;
  }
}